

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O0

FieldMap * __thiscall FIX::FieldMap::getGroupRef(FieldMap *this,int num,int tag)

{
  int iVar1;
  bool bVar2;
  FieldNotFound *pFVar3;
  pointer ppVar4;
  size_type sVar5;
  reference ppFVar6;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_c0;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_b8;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_82;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  _Self local_28;
  _Self local_20;
  const_iterator tagWithGroups;
  int tag_local;
  int num_local;
  FieldMap *this_local;
  
  tagWithGroups._M_node._0_4_ = tag;
  tagWithGroups._M_node._4_4_ = num;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::find((map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
               *)(this + 0x20),(key_type *)&tagWithGroups);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::end((map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
              *)(this + 0x20));
  bVar2 = std::operator==(&local_20,&local_28);
  if (bVar2) {
    local_5d = 1;
    pFVar3 = (FieldNotFound *)__cxa_allocate_exception(0x58);
    iVar1 = (int)tagWithGroups._M_node;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
    FieldNotFound::FieldNotFound(pFVar3,iVar1,&local_48);
    local_5d = 0;
    __cxa_throw(pFVar3,&FieldNotFound::typeinfo,FieldNotFound::~FieldNotFound);
  }
  if ((int)tagWithGroups._M_node._4_4_ < 1) {
    local_82 = 1;
    pFVar3 = (FieldNotFound *)__cxa_allocate_exception(0x58);
    iVar1 = (int)tagWithGroups._M_node;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
    FieldNotFound::FieldNotFound(pFVar3,iVar1,&local_80);
    local_82 = 0;
    __cxa_throw(pFVar3,&FieldNotFound::typeinfo,FieldNotFound::~FieldNotFound);
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
           ::operator->(&local_20);
  sVar5 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::size(&ppVar4->second);
  if (sVar5 < tagWithGroups._M_node._4_4_) {
    local_aa = 1;
    pFVar3 = (FieldNotFound *)__cxa_allocate_exception(0x58);
    iVar1 = (int)tagWithGroups._M_node;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
    FieldNotFound::FieldNotFound(pFVar3,iVar1,&local_a8);
    local_aa = 0;
    __cxa_throw(pFVar3,&FieldNotFound::typeinfo,FieldNotFound::~FieldNotFound);
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
           ::operator->(&local_20);
  local_c0._M_current =
       (FieldMap **)
       std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin(&ppVar4->second);
  local_b8 = __gnu_cxx::
             __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
             ::operator+(&local_c0,(long)(int)(tagWithGroups._M_node._4_4_ - 1));
  ppFVar6 = __gnu_cxx::
            __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
            ::operator*(&local_b8);
  return *ppFVar6;
}

Assistant:

EXCEPT(FieldNotFound) {
    Groups::const_iterator tagWithGroups = m_groups.find(tag);
    if (tagWithGroups == m_groups.end()) {
      throw FieldNotFound(tag);
    }
    if (num <= 0) {
      throw FieldNotFound(tag);
    }
    if (tagWithGroups->second.size() < static_cast<unsigned>(num)) {
      throw FieldNotFound(tag);
    }
    return *(*(tagWithGroups->second.begin() + (num - 1)));
  }